

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
llvm::SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>>::
emplace_back<int,llvm::SmallVector<unsigned_int,0u>>
          (SmallVectorImpl<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>> *this,
          int *Args,SmallVector<unsigned_int,_0U> *Args_1)

{
  size_t sVar1;
  size_t sVar2;
  iterator this_00;
  reference ppVar3;
  SmallVector<unsigned_int,_0U> *Args_local_1;
  int *Args_local;
  SmallVectorImpl<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>_> *this_local;
  
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar2 <= sVar1) {
    SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>::
    grow((SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
          *)this,0);
  }
  this_00 = SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
            ::end((SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                   *)this);
  std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>::
  pair<int,_llvm::SmallVector<unsigned_int,_0U>,_true>(this_00,Args,Args_1);
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar1 + 1);
  ppVar3 = SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
           ::back((SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                   *)this);
  return ppVar3;
}

Assistant:

reference emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
    return this->back();
  }